

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsvg.c
# Opt level: O0

void tt_face_free_svg(TT_Face face)

{
  FT_Memory memory_00;
  void *P;
  Svg *svg;
  FT_Stream stream;
  FT_Memory memory;
  TT_Face face_local;
  
  memory_00 = (face->root).memory;
  P = face->svg;
  if (P != (void *)0x0) {
    FT_Stream_ReleaseFrame((face->root).stream,(FT_Byte **)((long)P + 0x10));
    ft_mem_free(memory_00,P);
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  tt_face_free_svg( TT_Face  face )
  {
    FT_Memory  memory = face->root.memory;
    FT_Stream  stream = face->root.stream;

    Svg*  svg = (Svg*)face->svg;


    if ( svg )
    {
      FT_FRAME_RELEASE( svg->table );
      FT_FREE( svg );
    }
  }